

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O3

FT_Error pcf_interpret_style(PCF_Face pcf)

{
  char cVar1;
  FT_Memory memory;
  char *__src;
  PCF_Property pPVar2;
  size_t sVar3;
  FT_String *__dest;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  FT_Long FVar7;
  FT_Error error;
  char *strings [4];
  size_t lengths [4];
  FT_Error local_6c;
  char *local_68 [4];
  size_t local_48 [5];
  
  local_6c = 0;
  memory = (pcf->root).memory;
  local_68[2] = (char *)0x0;
  local_68[3] = (char *)0x0;
  local_68[0] = (char *)0x0;
  local_68[1] = (char *)0x0;
  (pcf->root).style_flags = 0;
  pPVar2 = pcf_find_property(pcf,"SLANT");
  FVar7 = 2;
  if ((((pPVar2 != (PCF_Property)0x0) && (pPVar2->isString != '\0')) &&
      (uVar5 = (byte)*(pPVar2->value).atom - 0x49, uVar5 < 0x27)) &&
     ((0x4100000041U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
    (pcf->root).style_flags = 1;
    local_68[2] = "Italic";
    if ((*(pPVar2->value).atom & 0xdfU) == 0x4f) {
      local_68[2] = "Oblique";
    }
    FVar7 = 3;
  }
  pPVar2 = pcf_find_property(pcf,"WEIGHT_NAME");
  if (((pPVar2 != (PCF_Property)0x0) && (pPVar2->isString != '\0')) &&
     ((byte)(*(pPVar2->value).atom | 0x20U) == 0x62)) {
    (pcf->root).style_flags = FVar7;
    local_68[1] = "Bold";
  }
  pPVar2 = pcf_find_property(pcf,"SETWIDTH_NAME");
  if ((pPVar2 != (PCF_Property)0x0) && (pPVar2->isString != '\0')) {
    cVar1 = *(pPVar2->value).atom;
    if ((cVar1 != '\0') && ((cVar1 != 'N' && (cVar1 != 'n')))) {
      local_68[3] = (pPVar2->value).atom;
    }
  }
  pPVar2 = pcf_find_property(pcf,"ADD_STYLE_NAME");
  if ((pPVar2 != (PCF_Property)0x0) && (pPVar2->isString != '\0')) {
    cVar1 = *(pPVar2->value).atom;
    if ((cVar1 != '\0') && ((cVar1 != 'N' && (cVar1 != 'n')))) {
      local_68[0] = (pPVar2->value).atom;
    }
  }
  FVar7 = 0;
  lVar6 = 0;
  do {
    local_48[lVar6] = 0;
    if (local_68[lVar6] != (char *)0x0) {
      sVar3 = strlen(local_68[lVar6]);
      local_48[lVar6] = sVar3;
      FVar7 = FVar7 + sVar3 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (FVar7 == 0) {
    local_68[0] = "Regular";
    local_48[0] = 7;
    FVar7 = 8;
  }
  __dest = (FT_String *)ft_mem_alloc(memory,FVar7,&local_6c);
  (pcf->root).style_name = __dest;
  if (local_6c == 0) {
    lVar6 = 0;
    do {
      __src = local_68[lVar6];
      if (__src != (char *)0x0) {
        sVar3 = local_48[lVar6];
        if (__dest != (pcf->root).style_name) {
          *__dest = ' ';
          __dest = __dest + 1;
        }
        memcpy(__dest,__src,sVar3);
        if (((lVar6 == 3) || (lVar6 == 0)) && (sVar3 != 0)) {
          sVar4 = 0;
          do {
            if (__dest[sVar4] == ' ') {
              __dest[sVar4] = '-';
            }
            sVar4 = sVar4 + 1;
          } while (sVar3 != sVar4);
        }
        __dest = __dest + sVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    *__dest = '\0';
  }
  return local_6c;
}

Assistant:

static FT_Error
  pcf_interpret_style( PCF_Face  pcf )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Face    face   = FT_FACE( pcf );
    FT_Memory  memory = face->memory;

    PCF_Property  prop;

    size_t  nn, len;
    char*   strings[4] = { NULL, NULL, NULL, NULL };
    size_t  lengths[4];


    face->style_flags = 0;

    prop = pcf_find_property( pcf, "SLANT" );
    if ( prop && prop->isString                                       &&
         ( *(prop->value.atom) == 'O' || *(prop->value.atom) == 'o' ||
           *(prop->value.atom) == 'I' || *(prop->value.atom) == 'i' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_ITALIC;
      strings[2] = ( *(prop->value.atom) == 'O' ||
                     *(prop->value.atom) == 'o' ) ? (char *)"Oblique"
                                                  : (char *)"Italic";
    }

    prop = pcf_find_property( pcf, "WEIGHT_NAME" );
    if ( prop && prop->isString                                       &&
         ( *(prop->value.atom) == 'B' || *(prop->value.atom) == 'b' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_BOLD;
      strings[1] = (char*)"Bold";
    }

    prop = pcf_find_property( pcf, "SETWIDTH_NAME" );
    if ( prop && prop->isString                                        &&
         *(prop->value.atom)                                           &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[3] = (char*)( prop->value.atom );

    prop = pcf_find_property( pcf, "ADD_STYLE_NAME" );
    if ( prop && prop->isString                                        &&
         *(prop->value.atom)                                           &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[0] = (char*)( prop->value.atom );

    for ( len = 0, nn = 0; nn < 4; nn++ )
    {
      lengths[nn] = 0;
      if ( strings[nn] )
      {
        lengths[nn] = ft_strlen( strings[nn] );
        len        += lengths[nn] + 1;
      }
    }

    if ( len == 0 )
    {
      strings[0] = (char*)"Regular";
      lengths[0] = ft_strlen( strings[0] );
      len        = lengths[0] + 1;
    }

    {
      char*  s;


      if ( FT_ALLOC( face->style_name, len ) )
        return error;

      s = face->style_name;

      for ( nn = 0; nn < 4; nn++ )
      {
        char*  src = strings[nn];


        len = lengths[nn];

        if ( !src )
          continue;

        /* separate elements with a space */
        if ( s != face->style_name )
          *s++ = ' ';

        ft_memcpy( s, src, len );

        /* need to convert spaces to dashes for */
        /* add_style_name and setwidth_name     */
        if ( nn == 0 || nn == 3 )
        {
          size_t  mm;


          for ( mm = 0; mm < len; mm++ )
            if ( s[mm] == ' ' )
              s[mm] = '-';
        }

        s += len;
      }
      *s = 0;
    }

    return error;
  }